

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  uint uVar1;
  undefined8 uVar2;
  REF_DBL *in_R8;
  char *pcVar3;
  int cell;
  int cell_00;
  double dVar4;
  double dVar5;
  REF_INT nodes [27];
  double local_b8;
  REF_INT local_a8 [30];
  
  if (0 < *(int *)((long)xyz + 0x2c)) {
    local_b8 = -999.0;
    cell_00 = -1;
    cell = 0;
    do {
      if (*(int *)((long)xyz[7] + (long)cell * (long)*(int *)(xyz + 1) * 4) != -1) {
        uVar1 = ref_cell_nodes((REF_CELL)xyz,cell,local_a8);
        if (uVar1 != 0) {
          pcVar3 = "cell";
          uVar2 = 0x378;
          goto LAB_00125442;
        }
        uVar1 = ref_node_bary4((REF_NODE)ref_grid,local_a8,(REF_DBL *)tet,in_R8);
        if ((uVar1 & 0xfffffffb) != 0) {
          pcVar3 = "bary";
          uVar2 = 0x379;
          goto LAB_00125442;
        }
        dVar4 = *in_R8;
        if (in_R8[1] <= *in_R8) {
          dVar4 = in_R8[1];
        }
        dVar5 = in_R8[2];
        if (in_R8[3] <= in_R8[2]) {
          dVar5 = in_R8[3];
        }
        if (dVar5 <= dVar4) {
          dVar4 = dVar5;
        }
        if ((cell_00 == -1) || (local_b8 < dVar4)) {
          cell_00 = cell;
          local_b8 = dVar4;
        }
      }
      cell = cell + 1;
    } while (cell < *(int *)((long)xyz + 0x2c));
    if (cell_00 != -1) {
      *(int *)bary = cell_00;
      uVar1 = ref_cell_nodes((REF_CELL)xyz,cell_00,local_a8);
      if (uVar1 == 0) {
        uVar1 = ref_node_bary4((REF_NODE)ref_grid,local_a8,(REF_DBL *)tet,in_R8);
        if (uVar1 == 0) {
          return 0;
        }
        pcVar3 = "bary";
        uVar2 = 0x385;
      }
      else {
        pcVar3 = "cell";
        uVar2 = 900;
      }
LAB_00125442:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar2,
             "ref_grid_exhaustive_enclosing_tet",(ulong)uVar1,pcVar3);
      return uVar1;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x381,
         "ref_grid_exhaustive_enclosing_tet","failed to find cell");
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,
                                                            REF_DBL *xyz,
                                                            REF_INT *tet,
                                                            REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess, best_guess;
  REF_DBL best_bary, min_bary;

  best_guess = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_valid_cell(ref_cell, guess) {
    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");
    min_bary = MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
    if (REF_EMPTY == best_guess || min_bary > best_bary) {
      best_guess = guess;
      best_bary = min_bary;
    }
  }

  RUS(REF_EMPTY, best_guess, "failed to find cell");

  *tet = best_guess;
  RSS(ref_cell_nodes(ref_cell, best_guess, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}